

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O3

void small_alloc_info(small_alloc *alloc,void *ptr,size_t size,small_alloc_info *info)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  if (alloc->objsize_max < size) {
    info->is_large = true;
    info->real_size = size;
    return;
  }
  uVar4 = (alloc->small_class).size_shift_plus_1;
  uVar5 = (uint)size - uVar4;
  if ((uint)size < uVar4) {
    uVar5 = 0;
  }
  uVar5 = uVar5 >> ((byte)(alloc->small_class).ignore_bits_count & 0x1f);
  if ((alloc->small_class).effective_size <= uVar5) {
    bVar1 = (byte)(alloc->small_class).effective_bits;
    uVar4 = uVar5 >> (bVar1 & 0x1f);
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar5 = (uVar5 >> ((byte)iVar2 & 0x1f)) + (iVar2 << (bVar1 & 0x1f));
  }
  info->is_large = false;
  uVar3 = (ulong)((alloc->small_mempool_cache[uVar5].used_pool)->pool).objsize;
  info->real_size = uVar3;
  if (size <= uVar3) {
    return;
  }
  __assert_fail("info->real_size >= size",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c",
                0x1de,
                "void small_alloc_info(struct small_alloc *, void *, size_t, struct small_alloc_info *)"
               );
}

Assistant:

void
small_alloc_info(struct small_alloc *alloc, void *ptr, size_t size,
		 struct small_alloc_info *info)
{
	(void)ptr;
	struct small_mempool *small_mempool = small_mempool_search(alloc, size);
	info->is_large = small_mempool == NULL;
	if (info->is_large)
		info->real_size = size;
	else
		info->real_size = small_mempool->used_pool->pool.objsize;
	assert(info->real_size >= size);
}